

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  ZSTD_CDict *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  undefined8 uVar5;
  seqDef *psVar6;
  uint uVar7;
  bool bVar8;
  U32 offCode;
  uint uVar9;
  U32 *pUVar10;
  ulong uVar11;
  U32 UVar12;
  size_t sVar13;
  BYTE *pBVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  repcodes_t updatedRepcodes;
  uint local_9c;
  U32 local_98 [4];
  uint local_88;
  int local_84;
  ZSTD_sequencePosition *local_80;
  BYTE *local_78;
  size_t local_70;
  size_t local_68;
  ulong local_60;
  ulong local_58;
  size_t local_50;
  ZSTD_Sequence *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  uVar11 = (ulong)seqPos->posInSequence;
  local_78 = (BYTE *)((long)src + blockSize);
  pZVar3 = cctx->cdict;
  if (pZVar3 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_50 = 0;
      goto LAB_001bc9d9;
    }
    pZVar3 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_50 = pZVar3->dictContentSize;
LAB_001bc9d9:
  UVar12 = seqPos->idx;
  uVar22 = seqPos->posInSequence + (int)blockSize;
  pZVar4 = (cctx->blockState).prevCBlock;
  local_98[2] = pZVar4->rep[2];
  uVar5 = *(undefined8 *)pZVar4->rep;
  local_98[0] = (U32)uVar5;
  local_98[1] = (U32)((ulong)uVar5 >> 0x20);
  local_38 = local_78 + -0x20;
  local_84 = 0;
  local_9c = 0;
  local_80 = seqPos;
  local_70 = inSeqsSize;
  local_58 = blockSize;
  local_48 = inSeqs;
  do {
    if (uVar22 == 0) {
      uVar22 = 0;
      goto LAB_001bce2f;
    }
    uVar16 = (ulong)UVar12;
    if ((inSeqsSize <= uVar16) || (local_84 != 0)) goto LAB_001bce2f;
    uVar9 = local_48[uVar16].litLength;
    uVar21 = local_48[uVar16].matchLength;
    uVar18 = (ulong)uVar21;
    uVar19 = uVar21 + uVar9;
    uVar23 = (uint)uVar11;
    if (uVar22 < uVar19) {
      iVar15 = 3;
      uVar21 = uVar22 - uVar9;
      if (uVar9 <= uVar22 && uVar21 != 0) {
        uVar7 = uVar9 - uVar23;
        if (uVar9 < uVar23) {
          uVar7 = 0;
        }
        if (local_58 < uVar18) {
          uVar20 = (uVar22 - uVar23) - uVar7;
          uVar23 = (cctx->appliedParams).cParams.minMatch;
          if (uVar20 < uVar23) goto LAB_001bcaaf;
          uVar19 = uVar19 - uVar22;
          iVar15 = 0;
          uVar9 = uVar23 - uVar19;
          if (uVar23 >= uVar19 && uVar9 != 0) {
            local_9c = uVar9;
          }
          if (uVar23 < uVar19) {
            uVar9 = 0;
          }
          uVar22 = uVar22 - uVar9;
          bVar8 = true;
          local_84 = 1;
          uVar18 = (ulong)(uVar20 - uVar9);
        }
        else {
LAB_001bcaaf:
          iVar15 = 3;
          bVar8 = false;
          uVar22 = uVar9;
          local_9c = uVar21;
        }
        if (bVar8) goto LAB_001bcade;
      }
    }
    else {
      uVar7 = uVar9 - uVar23;
      if (uVar9 < uVar23) {
        uVar7 = 0;
      }
      uVar20 = uVar23 - uVar9;
      if (uVar23 < uVar9) {
        uVar20 = 0;
      }
      uVar18 = (ulong)(uVar21 - uVar20);
      uVar11 = 0;
      uVar22 = uVar22 - uVar19;
LAB_001bcade:
      local_88 = UVar12;
      local_60 = uVar11;
      offCode = ZSTD_finalizeOffBase(local_48[uVar16].offset,local_98,(uint)(uVar7 == 0));
      UVar12 = local_98[1];
      if (offCode < 4) {
        if (offCode == 0) {
          __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
        }
        uVar9 = offCode - (uVar7 != 0);
        if (uVar9 != 0) {
          if (uVar9 == 3) {
            UVar12 = local_98[0] - 1;
          }
          else {
            UVar12 = local_98[uVar9];
          }
          pUVar10 = local_98 + 1;
          if (uVar9 == 1) {
            pUVar10 = local_98 + 2;
          }
          local_98[2] = *pUVar10;
          local_98[1] = local_98[0];
          local_98[0] = UVar12;
        }
      }
      else {
        local_98[1] = local_98[0];
        local_98[2] = UVar12;
        local_98[0] = offCode - 3;
      }
      uVar9 = (uint)uVar18;
      if ((cctx->appliedParams).validateSequences == 0) {
LAB_001bcbc4:
        if ((ulong)(local_88 - local_80->idx) < (cctx->seqStore).maxNbSeq) {
          if ((cctx->seqStore).maxNbSeq <=
              (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart >> 3)
             ) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar11 = (cctx->seqStore).maxNbLit;
          if (0x20000 < uVar11) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          pBVar14 = (cctx->seqStore).lit;
          if ((cctx->seqStore).litStart + uVar11 < pBVar14 + uVar7) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          pBVar2 = (BYTE *)((long)src + (ulong)uVar7);
          if (local_78 < pBVar2) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_38 < pBVar2) {
            local_40 = (BYTE *)src;
            ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,pBVar2,local_38);
            src = local_40;
          }
          else {
            uVar5 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar14 = *src;
            *(undefined8 *)(pBVar14 + 8) = uVar5;
            if (0x10 < uVar7) {
              pBVar14 = (cctx->seqStore).lit;
              if ((BYTE *)0xffffffffffffffe0 < pBVar14 + 0x10 + (-0x10 - ((long)src + 0x10))) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar5 = *(undefined8 *)((long)src + 0x18);
              *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
              *(undefined8 *)(pBVar14 + 0x18) = uVar5;
              if (0x20 < uVar7) {
                lVar17 = 0;
                do {
                  uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar17 + 0x20) + 8);
                  pBVar2 = pBVar14 + lVar17 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar17 + 0x20);
                  *(undefined8 *)(pBVar2 + 8) = uVar5;
                  uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar17 + 0x30) + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar17 + 0x30);
                  *(undefined8 *)(pBVar2 + 0x18) = uVar5;
                  lVar17 = lVar17 + 0x20;
                } while (pBVar2 + 0x20 < pBVar14 + uVar7);
              }
            }
          }
          ppBVar1 = &(cctx->seqStore).lit;
          *ppBVar1 = *ppBVar1 + uVar7;
          if (0xffff < uVar7) {
            if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
            (cctx->seqStore).longLengthPos =
                 (U32)((ulong)((long)(cctx->seqStore).sequences -
                              (long)(cctx->seqStore).sequencesStart) >> 3);
          }
          psVar6 = (cctx->seqStore).sequences;
          psVar6->litLength = (U16)uVar7;
          psVar6->offBase = offCode;
          if (uVar9 < 3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0xffff < uVar18 - 3) {
            if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
            (cctx->seqStore).longLengthPos =
                 (U32)((ulong)((long)psVar6 - (long)(cctx->seqStore).sequencesStart) >> 3);
          }
          psVar6->mlBase = (U16)(uVar18 - 3);
          src = (void *)((long)src + (ulong)(uVar9 + uVar7));
          (cctx->seqStore).sequences = psVar6 + 1;
          iVar15 = 0;
          inSeqsSize = local_70;
          uVar11 = local_60;
          UVar12 = local_88 + (local_84 == 0);
          goto LAB_001bce15;
        }
        local_68 = 0xffffffffffffff95;
        sVar13 = local_68;
      }
      else {
        sVar13 = (ulong)(uVar7 + uVar9) + local_80->posInSrc;
        local_80->posInSrc = sVar13;
        sVar13 = ZSTD_validateSequence
                           (offCode,uVar9,(cctx->appliedParams).cParams.minMatch,sVar13,
                            (cctx->appliedParams).cParams.windowLog,local_50,
                            (cctx->appliedParams).useSequenceProducer);
        if (sVar13 < 0xffffffffffffff89) goto LAB_001bcbc4;
      }
      local_68 = sVar13;
      iVar15 = 1;
      inSeqsSize = local_70;
      uVar11 = local_60;
      UVar12 = local_88;
    }
LAB_001bce15:
  } while (iVar15 == 0);
  uVar11 = local_68;
  if (iVar15 == 3) {
LAB_001bce2f:
    uVar11 = (ulong)UVar12;
    if ((uVar11 != inSeqsSize) &&
       (local_48[uVar11].matchLength + local_48[uVar11].litLength < uVar22)) {
      __assert_fail("idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x19b7,
                    "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    local_80->idx = UVar12;
    local_80->posInSequence = uVar22;
    pZVar4 = (cctx->blockState).nextCBlock;
    pZVar4->rep[2] = local_98[2];
    *(ulong *)pZVar4->rep = CONCAT44(local_98[1],local_98[0]);
    uVar11 = (ulong)local_9c;
    pBVar14 = local_78 + -uVar11;
    if ((BYTE *)src != pBVar14) {
      if (pBVar14 < src) {
        __assert_fail("ip <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x19c0,
                      "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                     );
      }
      uVar16 = (ulong)(uint)((int)pBVar14 - (int)src);
      memcpy((cctx->seqStore).lit,src,uVar16);
      ppBVar1 = &(cctx->seqStore).lit;
      *ppBVar1 = *ppBVar1 + uVar16;
      local_80->posInSrc = local_80->posInSrc + uVar16;
    }
  }
  return uVar11;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}